

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall Function::check_epilogue(Function *this,LinkedObjectFile *file)

{
  vector<Instruction,_std::allocator<Instruction>_> *this_00;
  int iVar1;
  pointer pBVar2;
  bool bVar3;
  Register RVar4;
  Register RVar5;
  Register RVar6;
  MatchParam<Register> dst_reg;
  long lVar7;
  reference pvVar8;
  reference pvVar9;
  MatchParam<Register> src0;
  MatchParam<Register> src;
  uint uVar10;
  MatchParam<Register> mem_reg;
  MatchParam<Register> dst_reg_00;
  MatchParam<Register> dst_reg_01;
  MatchParam<Register> dst;
  MatchParam<Register> dst_00;
  int iVar11;
  int iVar12;
  int iVar13;
  MatchParam<int> offset;
  MatchParam<int> offset_00;
  MatchParam<Register> src1;
  MatchParam<int> imm;
  MatchParam<Register> mem_reg_00;
  MatchParam<Register> mem_reg_01;
  MatchParam<Register> mem_reg_02;
  MatchParam<Register> dst_reg_02;
  size_type sVar14;
  MatchParam<int> offset_01;
  MatchParam<int> offset_02;
  int iVar15;
  
  if (((this->prologue).decoded != true) || (this->suspected_asm == true)) {
    puts("not decoded, or suspected asm, skipping epilogue");
    return;
  }
  this_00 = &this->instructions;
  lVar7 = ((long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0xd0;
  sVar14 = (size_type)(int)lVar7;
  lVar7 = (lVar7 << 0x20) + -0x100000000;
  do {
    sVar14 = sVar14 - 1;
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,sVar14);
    bVar3 = is_nop(pvVar8);
    lVar7 = lVar7 + -0x100000000;
  } while (bVar3);
  iVar11 = (int)sVar14;
  this->epilogue_end = iVar11;
  iVar12 = (this->prologue).total_stack_usage;
  pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,sVar14);
  RVar4 = make_gpr(SP);
  RVar5 = make_gpr(SP);
  RVar6 = make_gpr(R0);
  src0._2_2_ = 0;
  src0.value.id = RVar5.id;
  dst._2_2_ = 0;
  dst.value.id = RVar4.id;
  src1._2_2_ = 0;
  src1.value.id = RVar6.id;
  bVar3 = is_gpr_3(pvVar8,(MatchParam<InstructionKind>)0x3,dst,src0,src1);
  if (iVar12 == 0) {
    if (!bVar3) {
      __assert_fail("is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP), make_gpr(Reg::R0))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x166,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  else {
    if (bVar3) {
      pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,lVar7 >> 0x20);
      bVar3 = is_jr_ra(pvVar8);
      if (!bVar3) {
        __assert_fail("is_jr_ra(instructions.at(idx))",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x159,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      iVar11 = iVar11 + -2;
      puts("[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise");
      std::__cxx11::string::append((char *)&this->warnings);
    }
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,(long)iVar11);
    RVar4 = make_gpr(SP);
    RVar5 = make_gpr(SP);
    imm._4_4_ = 0;
    imm.value = (this->prologue).total_stack_usage;
    src._2_2_ = 0;
    src.value.id = RVar5.id;
    dst_00._2_2_ = 0;
    dst_00.value.id = RVar4.id;
    bVar3 = is_gpr_2_imm_int(pvVar8,(MatchParam<InstructionKind>)0x4,dst_00,src,imm);
    if (!bVar3) {
      __assert_fail("is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP), make_gpr(Reg::SP), prologue.total_stack_usage)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x161,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  iVar12 = iVar11 + -1;
  sVar14 = (size_type)iVar12;
  pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,sVar14);
  bVar3 = is_jr_ra(pvVar8);
  if (!bVar3) {
    __assert_fail("is_jr_ra(instructions.at(idx))",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,0x16b,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  iVar13 = 0;
  iVar15 = -1;
  uVar10 = 0;
  while( true ) {
    sVar14 = sVar14 - 1;
    iVar1 = (this->prologue).n_gpr_backup;
    if (iVar1 <= (int)uVar10) break;
    uVar10 = uVar10 + 1;
    pvVar9 = std::vector<Register,_std::allocator<Register>_>::at
                       ((vector<Register,_std::allocator<Register>_> *)
                        (anonymous_namespace)::gpr_backups,(long)(iVar1 + iVar15));
    offset.value = (this->prologue).gpr_backup_offset + iVar13;
    offset._4_4_ = 0;
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,sVar14);
    dst_reg_02._2_2_ = 0;
    dst_reg_02.value.id = pvVar9->id;
    RVar4 = make_gpr(SP);
    mem_reg_00._2_2_ = 0;
    mem_reg_00.value.id = RVar4.id;
    bVar3 = is_no_ll_gpr_load(pvVar8,(MatchParam<int>)0x10,(MatchParam<bool>)0x1,dst_reg_02,offset,
                              mem_reg_00);
    iVar13 = iVar13 + 0x10;
    iVar15 = iVar15 + -1;
    if (!bVar3) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x174,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  sVar14 = (size_type)(int)((iVar11 + -2) - uVar10);
  lVar7 = sVar14 << 0x20;
  iVar13 = 0;
  iVar11 = -1;
  for (iVar15 = 0; iVar1 = (this->prologue).n_fpr_backup, iVar15 < iVar1; iVar15 = iVar15 + 1) {
    pvVar9 = std::vector<Register,_std::allocator<Register>_>::at
                       ((vector<Register,_std::allocator<Register>_> *)
                        (anonymous_namespace)::fpr_backups,(long)(iVar1 + iVar11));
    offset_00.value = (this->prologue).fpr_backup_offset + iVar13;
    offset_00._4_4_ = 0;
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,sVar14);
    dst_reg._2_2_ = 0;
    dst_reg.value.id = pvVar9->id;
    RVar4 = make_gpr(SP);
    mem_reg._2_2_ = 0;
    mem_reg.value.id = RVar4.id;
    bVar3 = is_no_ll_fpr_load(pvVar8,dst_reg,offset_00,mem_reg);
    if (!bVar3) {
      __assert_fail("is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x17e,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    sVar14 = sVar14 - 1;
    lVar7 = lVar7 + -0x100000000;
    uVar10 = uVar10 + 1;
    iVar13 = iVar13 + 4;
    iVar11 = iVar11 + -1;
  }
  if ((this->prologue).fp_backed_up == false) {
    iVar12 = ~uVar10 + iVar12;
  }
  else {
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,lVar7 >> 0x20);
    RVar4 = make_gpr(FP);
    offset_01._4_4_ = 0;
    offset_01.value = (this->prologue).fp_backup_offset;
    RVar5 = make_gpr(SP);
    dst_reg_00._2_2_ = 0;
    dst_reg_00.value.id = RVar4.id;
    mem_reg_01._2_2_ = 0;
    mem_reg_01.value.id = RVar5.id;
    bVar3 = is_no_ll_gpr_load(pvVar8,(MatchParam<int>)0x8,(MatchParam<bool>)0x1,dst_reg_00,offset_01
                              ,mem_reg_01);
    if (!bVar3) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP), prologue.fp_backup_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x185,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar12 = (iVar12 - uVar10) + -2;
  }
  if ((this->prologue).ra_backed_up == true) {
    pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::at(this_00,(long)iVar12);
    RVar4 = make_gpr(RA);
    offset_02._4_4_ = 0;
    offset_02.value = (this->prologue).ra_backup_offset;
    RVar5 = make_gpr(SP);
    dst_reg_01._2_2_ = 0;
    dst_reg_01.value.id = RVar4.id;
    mem_reg_02._2_2_ = 0;
    mem_reg_02.value.id = RVar5.id;
    bVar3 = is_no_ll_gpr_load(pvVar8,(MatchParam<int>)0x8,(MatchParam<bool>)0x1,dst_reg_01,offset_02
                              ,mem_reg_02);
    if (!bVar3) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA), prologue.ra_backup_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x18c,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar12 = iVar12 + -1;
  }
  pBVar2 = (this->basic_blocks).super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->basic_blocks).super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>._M_impl.
      super__Vector_impl_data._M_start == pBVar2) {
    __assert_fail("!basic_blocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,400,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  iVar12 = iVar12 + 1;
  if (iVar12 < pBVar2[-1].start_word) {
    __assert_fail("idx + 1 >= basic_blocks.back().start_word",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,0x191,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  pBVar2[-1].end_word = iVar12;
  (this->prologue).epilogue_ok = true;
  this->epilogue_start = iVar12;
  return;
}

Assistant:

void Function::check_epilogue(const LinkedObjectFile& file) {
  (void)file;
  if (!prologue.decoded || suspected_asm) {
    printf("not decoded, or suspected asm, skipping epilogue\n");
    return;
  }

  // start at the end and move up.
  int idx = int(instructions.size()) - 1;

  // seek past alignment nops
  while (is_nop(instructions.at(idx))) {
    idx--;
  }

  epilogue_end = idx;
  // stack restore
  if (prologue.total_stack_usage) {
    // hack - sometimes an asm function has a compiler inserted jr ra/daddu sp sp r0 that follows
    // the "true" return.  We really should have this function flagged as asm, but for now, we can
    // simply skip over the compiler-generated jr ra/daddu sp sp r0.
    if (is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP),
                 make_gpr(Reg::R0))) {
      idx--;
      assert(is_jr_ra(instructions.at(idx)));
      idx--;
      printf(
          "[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise\n");
      warnings += "Double Return Epilogue - this is probably an ASM function\n";
    }
    // delay slot should be daddiu sp, sp, offset
    assert(is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP),
                            make_gpr(Reg::SP), prologue.total_stack_usage));
    idx--;
  } else {
    // delay slot is always daddu sp, sp, r0...
    assert(is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP),
                    make_gpr(Reg::SP), make_gpr(Reg::R0)));
    idx--;
  }

  // jr ra
  assert(is_jr_ra(instructions.at(idx)));
  idx--;

  // restore gprs
  for (int i = 0; i < prologue.n_gpr_backup; i++) {
    int gpr_idx = prologue.n_gpr_backup - (1 + i);
    const auto& expected_reg = gpr_backups.at(gpr_idx);
    auto expected_offset = prologue.gpr_backup_offset + 16 * i;
    assert(is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset,
                             make_gpr(Reg::SP)));
    idx--;
  }

  // restore fprs
  for (int i = 0; i < prologue.n_fpr_backup; i++) {
    int fpr_idx = prologue.n_fpr_backup - (1 + i);
    const auto& expected_reg = fpr_backups.at(fpr_idx);
    auto expected_offset = prologue.fpr_backup_offset + 4 * i;
    assert(
        is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore fp
  if (prologue.fp_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP),
                             prologue.fp_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore ra
  if (prologue.ra_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA),
                             prologue.ra_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  assert(!basic_blocks.empty());
  assert(idx + 1 >= basic_blocks.back().start_word);
  basic_blocks.back().end_word = idx + 1;
  prologue.epilogue_ok = true;
  epilogue_start = idx + 1;
}